

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001384 [12];
  anon_class_8_1_8991fb9c getMaxDensity;
  Bounds3f bounds;
  anon_class_8_1_8991fb9c local_78;
  Bounds3f local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->ptr = (float *)SUB168(ZEXT816(0) << 0x40,0);
  __return_storage_ptr__->nAlloc = SUB168(ZEXT816(0) << 0x40,8);
  __return_storage_ptr__->nStored = 0;
  (res->super_Tuple3<pbrt::Point3,_int>).x = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 4;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(__return_storage_ptr__,0x40)
  ;
  if (0 < (res->super_Tuple3<pbrt::Point3,_int>).z) {
    iVar4 = 0;
    iVar5 = 0;
    local_78.this = this;
    do {
      if (0 < (res->super_Tuple3<pbrt::Point3,_int>).y) {
        iVar6 = 0;
        do {
          uVar3 = (res->super_Tuple3<pbrt::Point3,_int>).x;
          if (0 < (int)uVar3) {
            local_48._0_4_ = (undefined4)iVar6;
            local_48._4_12_ = in_register_00001384;
            local_58._0_4_ = (undefined4)(iVar6 + 1);
            local_58._4_12_ = in_register_00001384;
            lVar7 = 0;
            do {
              auVar9._0_4_ = (float)(int)lVar7;
              auVar9._4_12_ = in_register_00001384;
              auVar1 = vinsertps_avx(auVar9,ZEXT416((uint)local_48._0_4_),0x10);
              fVar10 = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
              auVar12._0_4_ = (float)iVar4 / fVar10;
              auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar13._0_4_ = (float)((int)lVar7 + 1);
              auVar13._4_12_ = in_register_00001384;
              auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)local_58._0_4_),0x10);
              auVar11 = ZEXT416((uint)((float)(iVar4 + 1) / fVar10));
              auVar9 = vpinsrd_avx(ZEXT416(uVar3),(res->super_Tuple3<pbrt::Point3,_int>).y,1);
              auVar9 = vcvtdq2ps_avx(auVar9);
              auVar1 = vdivps_avx(auVar1,auVar9);
              auVar9 = vdivps_avx(auVar13,auVar9);
              auVar13 = vminps_avx(auVar9,auVar1);
              auVar2 = vminss_avx(auVar11,auVar12);
              local_70.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
              local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar2._0_4_;
              auVar9 = vmaxps_avx(auVar9,auVar1);
              auVar1 = vmaxss_avx(auVar11,auVar12);
              local_70.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
              local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar1._0_4_;
              FVar8 = GetMaxDensityGrid::anon_class_8_1_8991fb9c::operator()(&local_78,&local_70);
              __return_storage_ptr__->ptr[iVar5 + lVar7] = FVar8;
              uVar3 = (res->super_Tuple3<pbrt::Point3,_int>).x;
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < (int)uVar3);
            iVar5 = iVar5 + (int)lVar7;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (res->super_Tuple3<pbrt::Point3,_int>).y);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (res->super_Tuple3<pbrt::Point3,_int>).z);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        pstd::vector<Float> maxGrid(alloc);
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(4, 4, 4);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaximumValue(bounds);
            else {
                // Compute maximum density of RGB density over _bounds_
                int nx = rgbDensityGrid->xSize();
                int ny = rgbDensityGrid->ySize();
                int nz = rgbDensityGrid->zSize();
                Point3f ps[2] = {
                    Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                            bounds.pMin.z * nz - .5f),
                    Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                            bounds.pMax.z * nz - .5f)};
                Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                                 Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                                     Point3i(nx - 1, ny - 1, nz - 1))};

                std::vector<SampledWavelengths> lambdas;
                for (Float u : Stratified1D(16))
                    lambdas.push_back(SampledWavelengths::SampleXYZ(u));

                Float maxDensity = 0;
                for (int z = pi[0].z; z <= pi[1].z; ++z)
                    for (int y = pi[0].y; y <= pi[1].y; ++y)
                        for (int x = pi[0].x; x <= pi[1].x; ++x) {
                            RGB rgb = rgbDensityGrid->Lookup(Point3i(x, y, z));

                            Float maxComponent = std::max({rgb.r, rgb.g, rgb.b});
                            if (maxComponent == 0)
                                continue;

                            RGBSpectrum spec(*colorSpace, rgb);
                            for (const SampledWavelengths &lambda : lambdas) {
                                SampledSpectrum s = spec.Sample(lambda);
                                maxDensity = std::max(maxDensity, s.MaxComponentValue());
                            }
                        }

                return maxDensity * 1.025f;
            }
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (int z = 0; z < res->z; ++z)
            for (int y = 0; y < res->y; ++y)
                for (int x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(Float(x) / res->x, Float(y) / res->y, Float(z) / res->z),
                        Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                Float(z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }